

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnDiskFileIndex.cpp
# Opt level: O2

void __thiscall OnDiskFileIndex::generate_namecache_file(OnDiskFileIndex *this)

{
  string *__source;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  string_view_t fmt;
  string_view_t fmt_00;
  uint64_t count;
  undefined1 local_2a8 [16];
  code *local_298;
  code *pcStack_290;
  uint64_t offset;
  ofstream of;
  
  __source = &this->cache_fname;
  fmt.size_ = (size_t)__source;
  fmt.data_ = (char *)0x22;
  spdlog::debug<std::__cxx11::string>((spdlog *)"Namecache {} not found, generating",fmt,in_RCX);
  std::ofstream::ofstream(&of);
  std::ios::exceptions((int)&of + (int)*(undefined8 *)(_of + -0x18));
  std::experimental::filesystem::v1::__cxx11::path::
  path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>
            ((path *)&offset,__source);
  std::experimental::filesystem::v1::__cxx11::operator/
            ((path *)local_2a8,&this->db_base,(path *)&offset);
  std::ofstream::open((char *)&of,local_2a8._0_4_);
  std::experimental::filesystem::v1::__cxx11::path::~path((path *)local_2a8);
  std::experimental::filesystem::v1::__cxx11::path::~path((path *)&offset);
  offset = 0;
  count = 0;
  local_298 = (code *)0x0;
  pcStack_290 = (code *)0x0;
  local_2a8._0_8_ = (pointer)0x0;
  local_2a8._8_8_ = 0;
  local_2a8._0_8_ = operator_new(0x18);
  *(ofstream **)local_2a8._0_8_ = &of;
  *(path **)(local_2a8._0_8_ + 8) = (path *)&offset;
  args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&count;
  *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(local_2a8._0_8_ + 0x10) =
       args;
  pcStack_290 = std::
                _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/libursa/OnDiskFileIndex.cpp:16:23)>
                ::_M_invoke;
  local_298 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/libursa/OnDiskFileIndex.cpp:16:23)>
              ::_M_manager;
  for_each_filename(this,(function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                          *)local_2a8);
  std::_Function_base::~_Function_base((_Function_base *)local_2a8);
  this->file_count = count;
  std::ostream::write((char *)&of,(long)&offset);
  std::ostream::flush();
  fmt_00.size_ = (size_t)__source;
  fmt_00.data_ = (char *)0x8;
  spdlog::info<std::__cxx11::string>((spdlog *)"SAVE: {}",fmt_00,args);
  std::ofstream::~ofstream(&of);
  return;
}

Assistant:

void OnDiskFileIndex::generate_namecache_file() {
    spdlog::debug("Namecache {} not found, generating", cache_fname);

    std::ofstream of;
    of.exceptions(std::ofstream::badbit);
    of.open(db_base / cache_fname, std::ofstream::binary);

    uint64_t offset = 0;
    uint64_t count = 0;
    for_each_filename([&of, &offset, &count](const std::string &fname) {
        of.write(reinterpret_cast<char *>(&offset), sizeof(offset));
        offset += fname.size() + 1;
        count += 1;
    });
    file_count = count;
    of.write(reinterpret_cast<char *>(&offset), sizeof(offset));
    of.flush();
    spdlog::info("SAVE: {}", cache_fname);
}